

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

string * __thiscall
tinyusdz::value::pprint_value_abi_cxx11_
          (string *__return_storage_ptr__,value *this,Value *v,uint32_t indent,bool closing_brace)

{
  pointer pbVar1;
  undefined8 uVar2;
  int iVar3;
  ValueBlock *pVVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  Model *this_00;
  SphereLight *this_01;
  SkelRoot *this_02;
  Material *this_03;
  ostream *poVar6;
  DistantLight *this_04;
  DiskLight *this_05;
  DomeLight *this_06;
  CylinderLight *this_07;
  Shader *this_08;
  texcoord3h *v_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *customData;
  texcoord3d *v_01;
  matrix4d *m;
  color3f *v_02;
  normal3f *v_03;
  vector3d *v_04;
  color3d *v_05;
  double *pdVar7;
  array<unsigned_int,_3UL> *v_06;
  array<float,_2UL> *v_07;
  array<float,_4UL> *v_08;
  color4d *v_09;
  quatd *v_10;
  array<tinyusdz::value::half,_2UL> *v_11;
  array<float,_3UL> *v_12;
  long *plVar8;
  array<tinyusdz::value::half,_3UL> *v_13;
  array<double,_2UL> *v_14;
  normal3d *v_15;
  matrix3d *m_00;
  int *piVar9;
  StringData *v_16;
  array<tinyusdz::value::half,_4UL> *v_17;
  float *pfVar10;
  texcoord2f *v_18;
  array<unsigned_int,_2UL> *v_19;
  bool *pbVar11;
  half *v_20;
  unsigned_long *puVar12;
  array<double,_4UL> *v_21;
  string *str;
  point3h *v_22;
  color4f *v_23;
  array<int,_4UL> *v_24;
  array<int,_2UL> *v_25;
  array<int,_3UL> *v_26;
  texcoord2d *v_27;
  quatf *v_28;
  AssetPath *asset;
  quath *v_29;
  point3d *v_30;
  array<unsigned_int,_4UL> *v_31;
  normal3h *v_32;
  array<double,_3UL> *v_33;
  vector3f *v_34;
  matrix2d *m_01;
  texcoord3f *v_35;
  point3f *v_36;
  texcoord2h *v_37;
  vector3h *v_38;
  GeomCone *this_09;
  GeomNurbsCurves *this_10;
  GeomBasisCurves *this_11;
  tinyusdz *this_12;
  GeomCube *this_13;
  Scope *this_14;
  GeomSphere *this_15;
  GeomMesh *this_16;
  GeomCylinder *this_17;
  GeomCapsule *this_18;
  GeomPoints *this_19;
  GeomCamera *this_20;
  PointInstancer *this_21;
  GeomSubset *this_22;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *v_39;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *v_40;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *v_41;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *v_42;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *v_43;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *v_44;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *v_45;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *v_46;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *v_47;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *v_48;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *v_49;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *v_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v_51;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *v_52;
  vector<float,_std::allocator<float>_> *v_53;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *v_54;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *v_55;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *v_56;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *v_57;
  vector<int,_std::allocator<int>_> *v_58;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *v_59;
  vector<bool,_std::allocator<bool>_> *v_60;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *v_61;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_62;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> *v_63;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *v_64;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *v_65;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *v_66;
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *v_67;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *v_68;
  vector<long,_std::allocator<long>_> *v_69;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *v_70;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *v_71;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *v_72;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *v_73;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *v_74;
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> *v_75;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *v_76;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *v_77;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *v_78;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *v_79;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *v_80;
  vector<double,_std::allocator<double>_> *v_81;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *v_82;
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *v_83;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *v_84;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *v_85;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *v_86;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *v_87;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *v_88;
  SkelAnimation *this_23;
  BlendShape *this_24;
  Skeleton *this_25;
  long lVar13;
  GeomMesh *mesh;
  _anonymous_namespace_ *p_Var14;
  undefined8 uVar15;
  char *pcVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  pointer str_00;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  stringstream os;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  mesh = (GeomMesh *)((ulong)v & 0xffffffff);
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (*(undefined8 **)(this + 0x10) == (undefined8 *)0x0) goto switchD_002955f6_caseD_5;
  iVar3 = (*(code *)**(undefined8 **)(this + 0x10))();
  if (0x600 < iVar3) {
    if (iVar3 < 0x2001) {
      switch(iVar3) {
      case 0x601:
        this_01 = Value::as<tinyusdz::SphereLight>((Value *)this,false);
        if (this_01 == (SphereLight *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_01,(SphereLight *)mesh,indent & 0xff,
                   closing_brace);
        break;
      case 0x602:
        this_06 = Value::as<tinyusdz::DomeLight>((Value *)this,false);
        if (this_06 == (DomeLight *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_06,(DomeLight *)mesh,indent & 0xff,
                   closing_brace);
        break;
      case 0x603:
        this_07 = Value::as<tinyusdz::CylinderLight>((Value *)this,false);
        if (this_07 == (CylinderLight *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_07,(CylinderLight *)mesh,indent & 0xff,
                   closing_brace);
        break;
      case 0x604:
        this_05 = Value::as<tinyusdz::DiskLight>((Value *)this,false);
        if (this_05 == (DiskLight *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_05,(DiskLight *)mesh,indent & 0xff,
                   closing_brace);
        break;
      case 0x605:
        goto switchD_002955f6_caseD_5;
      case 0x606:
        this_04 = Value::as<tinyusdz::DistantLight>((Value *)this,false);
        if (this_04 == (DistantLight *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_04,(DistantLight *)mesh,indent & 0xff,
                   closing_brace);
        break;
      default:
        if (iVar3 == 0x801) {
          this_08 = Value::as<tinyusdz::Shader>((Value *)this,false);
          if (this_08 == (Shader *)0x0) goto LAB_00296ce5;
          tinyusdz::to_string_abi_cxx11_
                    ((string *)local_1f8,(tinyusdz *)this_08,(Shader *)mesh,indent & 0xff,
                     closing_brace);
        }
        else {
          if (iVar3 != 0x802) goto switchD_002955f6_caseD_5;
          this_03 = Value::as<tinyusdz::Material>((Value *)this,false);
          if (this_03 == (Material *)0x0) goto LAB_00296ce5;
          tinyusdz::to_string_abi_cxx11_
                    ((string *)local_1f8,(tinyusdz *)this_03,(Material *)mesh,indent & 0xff,
                     closing_brace);
        }
      }
      goto LAB_00296cba;
    }
    switch(iVar3) {
    case 0x100007:
      pvVar5 = Value::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((Value *)this,false);
      if (pvVar5 != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
        local_1d8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        aStack_1c8._M_allocated_capacity = 0;
        str_00 = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (str_00 != pbVar1) {
          do {
            buildEscapedAndQuotedStringForUSDA((string *)local_1f8,str_00);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_1d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._0_8_ != &local_1e8) {
              operator_delete((void *)local_1f8._0_8_,local_1e8._M_allocated_capacity + 1);
            }
            str_00 = str_00 + 1;
          } while (str_00 != pbVar1);
        }
        ::std::operator<<(local_1a8,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1d8);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d8);
        goto LAB_00296cf9;
      }
      goto LAB_00296dcb;
    case 0x100008:
      v_67 = Value::
             as<std::vector<tinyusdz::value::StringData,std::allocator<tinyusdz::value::StringData>>>
                       ((Value *)this,false);
      if (v_67 != (vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_67);
        goto LAB_00296cf9;
      }
LAB_00296dcb:
      pcVar16 = "[InternalError: `string[]` type TypeId mismatch.]";
LAB_00296dd2:
      lVar13 = 0x31;
      goto LAB_00296cf4;
    case 0x100009:
      v_60 = Value::as<std::vector<bool,std::allocator<bool>>>((Value *)this,false);
      if (v_60 != (vector<bool,_std::allocator<bool>_> *)0x0) {
        ::std::operator<<(local_1a8,v_60);
        goto LAB_00296cf9;
      }
      break;
    case 0x10000a:
    case 0x10000b:
    case 0x10000c:
    case 0x10000d:
    case 0x100017:
    case 0x100018:
    case 0x100019:
    case 0x10001a:
    case 0x10001d:
    case 0x10001e:
    case 0x10001f:
    case 0x100020:
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100024:
    case 0x100033:
    case 0x100034:
    case 0x100035:
    case 0x100039:
    case 0x10003c:
    case 0x100048:
    case 0x10004f:
    case 0x100050:
      goto switchD_002955f6_caseD_5;
    case 0x10000e:
      v_64 = Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                       ((Value *)this,false);
      if (v_64 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
        ::std::operator<<(local_1a8,v_64);
        goto LAB_00296cf9;
      }
      break;
    case 0x10000f:
      v_58 = Value::as<std::vector<int,std::allocator<int>>>((Value *)this,false);
      if (v_58 != (vector<int,_std::allocator<int>_> *)0x0) {
        ::std::operator<<(local_1a8,v_58);
        goto LAB_00296cf9;
      }
      break;
    case 0x100010:
      v_69 = Value::as<std::vector<long,std::allocator<long>>>((Value *)this,false);
      if (v_69 != (vector<long,_std::allocator<long>_> *)0x0) {
        ::std::operator<<(local_1a8,v_69);
        goto LAB_00296cf9;
      }
      break;
    case 0x100011:
      v_66 = Value::
             as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                       ((Value *)this,false);
      if (v_66 != (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_66);
        goto LAB_00296cf9;
      }
      break;
    case 0x100012:
      v_71 = Value::
             as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                       ((Value *)this,false);
      if (v_71 != (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_71);
        goto LAB_00296cf9;
      }
      break;
    case 0x100013:
      v_70 = Value::
             as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                       ((Value *)this,false);
      if (v_70 != (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_70);
        goto LAB_00296cf9;
      }
      break;
    case 0x100014:
      v_72 = Value::as<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                       ((Value *)this,false);
      if (v_72 != (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)0x0) {
        ::std::operator<<(local_1a8,v_72);
        goto LAB_00296cf9;
      }
      break;
    case 0x100015:
      v_77 = Value::as<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                       ((Value *)this,false);
      if (v_77 != (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)0x0) {
        ::std::operator<<(local_1a8,v_77);
        goto LAB_00296cf9;
      }
      break;
    case 0x100016:
      v_76 = Value::as<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                       ((Value *)this,false);
      if (v_76 != (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
        ::std::operator<<(local_1a8,v_76);
        goto LAB_00296cf9;
      }
      break;
    case 0x10001b:
      v_62 = Value::as<std::vector<unsigned_int,std::allocator<unsigned_int>>>((Value *)this,false);
      if (v_62 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        ::std::operator<<(local_1a8,v_62);
        goto LAB_00296cf9;
      }
      break;
    case 0x10001c:
      v_51 = Value::as<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((Value *)this,false);
      if (v_51 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        ::std::operator<<(local_1a8,v_51);
        goto LAB_00296cf9;
      }
      break;
    case 0x100025:
      v_74 = Value::
             as<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                       ((Value *)this,false);
      if (v_74 != (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_74);
        goto LAB_00296cf9;
      }
      break;
    case 0x100026:
      v_63 = Value::
             as<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                       ((Value *)this,false);
      if (v_63 != (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_63);
        goto LAB_00296cf9;
      }
      break;
    case 0x100027:
      v_75 = Value::
             as<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                       ((Value *)this,false);
      if (v_75 != (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_75);
        goto LAB_00296cf9;
      }
      break;
    case 0x100028:
      v_53 = Value::as<std::vector<float,std::allocator<float>>>((Value *)this,false);
      if (v_53 != (vector<float,_std::allocator<float>_> *)0x0) {
        ::std::operator<<(local_1a8,v_53);
        goto LAB_00296cf9;
      }
      pcVar16 = "[InternalError: TypeId mismatch(`float[]` expected).]";
      lVar13 = 0x35;
      goto LAB_00296cf4;
    case 0x100029:
      v_54 = Value::as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                       ((Value *)this,false);
      if (v_54 != (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x0) {
        ::std::operator<<(local_1a8,v_54);
        goto LAB_00296cf9;
      }
      break;
    case 0x10002a:
      v_44 = Value::as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                       ((Value *)this,false);
      if (v_44 != (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0) {
        ::std::operator<<(local_1a8,v_44);
        goto LAB_00296cf9;
      }
      break;
    case 0x10002b:
      v_56 = Value::as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                       ((Value *)this,false);
      if (v_56 != (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0) {
        ::std::operator<<(local_1a8,v_56);
        goto LAB_00296cf9;
      }
      break;
    case 0x10002c:
      v_81 = Value::as<std::vector<double,std::allocator<double>>>((Value *)this,false);
      if (v_81 != (vector<double,_std::allocator<double>_> *)0x0) {
        ::std::operator<<(local_1a8,v_81);
        goto LAB_00296cf9;
      }
      pcVar16 = "[InternalError: TypeId mismatch(`double[]` expected).]";
      lVar13 = 0x36;
      goto LAB_00296cf4;
    case 0x10002d:
      v_45 = Value::as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                       ((Value *)this,false);
      if (v_45 != (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0)
      {
        ::std::operator<<(local_1a8,v_45);
        goto LAB_00296cf9;
      }
      break;
    case 0x10002e:
      v_59 = Value::as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                       ((Value *)this,false);
      if (v_59 != (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)0x0)
      {
        ::std::operator<<(local_1a8,v_59);
        goto LAB_00296cf9;
      }
      break;
    case 0x10002f:
      v_65 = Value::as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                       ((Value *)this,false);
      if (v_65 != (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0)
      {
        ::std::operator<<(local_1a8,v_65);
        goto LAB_00296cf9;
      }
      break;
    case 0x100030:
      v_84 = Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                       ((Value *)this,false);
      if (v_84 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0) {
        ::std::operator<<(local_1a8,v_84);
        goto LAB_00296cf9;
      }
      break;
    case 0x100031:
      v_79 = Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                       ((Value *)this,false);
      if (v_79 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
        ::std::operator<<(local_1a8,v_79);
        goto LAB_00296cf9;
      }
      break;
    case 0x100032:
      v_80 = Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                       ((Value *)this,false);
      if (v_80 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0) {
        ::std::operator<<(local_1a8,v_80);
        goto LAB_00296cf9;
      }
      break;
    case 0x100036:
      v_48 = Value::
             as<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                       ((Value *)this,false);
      if (v_48 != (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_48);
        goto LAB_00296cf9;
      }
      break;
    case 0x100037:
      v_83 = Value::
             as<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                       ((Value *)this,false);
      if (v_83 != (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_83);
        goto LAB_00296cf9;
      }
      break;
    case 0x100038:
      v_42 = Value::
             as<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                       ((Value *)this,false);
      if (v_42 != (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_42);
        goto LAB_00296cf9;
      }
      break;
    case 0x10003a:
      v_57 = Value::
             as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                       ((Value *)this,false);
      if (v_57 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)0x0
         ) {
        ::std::operator<<(local_1a8,v_57);
        goto LAB_00296cf9;
      }
      break;
    case 0x10003b:
      v_46 = Value::
             as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                       ((Value *)this,false);
      if (v_46 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)0x0
         ) {
        ::std::operator<<(local_1a8,v_46);
        goto LAB_00296cf9;
      }
      break;
    case 0x10003d:
      v_61 = Value::
             as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                       ((Value *)this,false);
      if (v_61 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)0x0
         ) {
        ::std::operator<<(local_1a8,v_61);
        goto LAB_00296cf9;
      }
      break;
    case 0x10003e:
      v_52 = Value::
             as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                       ((Value *)this,false);
      if (v_52 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)0x0
         ) {
        ::std::operator<<(local_1a8,v_52);
        goto LAB_00296cf9;
      }
      break;
    case 0x10003f:
      v_43 = Value::
             as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                       ((Value *)this,false);
      if (v_43 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)0x0
         ) {
        ::std::operator<<(local_1a8,v_43);
        goto LAB_00296cf9;
      }
      break;
    case 0x100040:
      v_82 = Value::
             as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                       ((Value *)this,false);
      if (v_82 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)0x0
         ) {
        ::std::operator<<(local_1a8,v_82);
        goto LAB_00296cf9;
      }
      break;
    case 0x100041:
      v_85 = Value::
             as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                       ((Value *)this,false);
      if (v_85 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)0x0
         ) {
        ::std::operator<<(local_1a8,v_85);
        goto LAB_00296cf9;
      }
      break;
    case 0x100042:
      v_40 = Value::
             as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                       ((Value *)this,false);
      if (v_40 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_40);
        goto LAB_00296cf9;
      }
      break;
    case 0x100043:
      v_78 = Value::
             as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                       ((Value *)this,false);
      if (v_78 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_78);
        goto LAB_00296cf9;
      }
      break;
    case 0x100044:
      v_55 = Value::
             as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                       ((Value *)this,false);
      if (v_55 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_55);
        goto LAB_00296cf9;
      }
      break;
    case 0x100045:
      v_87 = Value::
             as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                       ((Value *)this,false);
      if (v_87 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_87);
        goto LAB_00296cf9;
      }
      break;
    case 0x100046:
      v_68 = Value::
             as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                       ((Value *)this,false);
      if (v_68 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_68);
        goto LAB_00296cf9;
      }
      break;
    case 0x100047:
      v_50 = Value::
             as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                       ((Value *)this,false);
      if (v_50 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                  0x0) {
        ::std::operator<<(local_1a8,v_50);
        goto LAB_00296cf9;
      }
      break;
    case 0x100049:
      v_49 = Value::
             as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                       ((Value *)this,false);
      if (v_49 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_49);
        goto LAB_00296cf9;
      }
      break;
    case 0x10004a:
      v_86 = Value::
             as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                       ((Value *)this,false);
      if (v_86 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_86);
        goto LAB_00296cf9;
      }
      break;
    case 0x10004b:
      v_41 = Value::
             as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                       ((Value *)this,false);
      if (v_41 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_41);
        goto LAB_00296cf9;
      }
      break;
    case 0x10004c:
      v_47 = Value::
             as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                       ((Value *)this,false);
      if (v_47 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_47);
        goto LAB_00296cf9;
      }
      break;
    case 0x10004d:
      v_39 = Value::
             as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                       ((Value *)this,false);
      if (v_39 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_39);
        goto LAB_00296cf9;
      }
      break;
    case 0x10004e:
      v_73 = Value::
             as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                       ((Value *)this,false);
      if (v_73 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                   *)0x0) {
        ::std::operator<<(local_1a8,v_73);
        goto LAB_00296cf9;
      }
      break;
    case 0x100051:
      v_88 = Value::
             as<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                       ((Value *)this,false);
      if (v_88 != (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *
                  )0x0) {
        ::std::operator<<(local_1a8,v_88);
        goto LAB_00296cf9;
      }
      pcVar16 = "[InternalError: asset[] type TypeId mismatch.]";
      lVar13 = 0x2e;
      goto LAB_00296cf4;
    default:
      switch(iVar3) {
      case 0x2001:
        this_02 = Value::as<tinyusdz::SkelRoot>((Value *)this,false);
        if (this_02 == (SkelRoot *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_02,(SkelRoot *)mesh,indent & 0xff,
                   closing_brace);
        break;
      case 0x2002:
        this_25 = Value::as<tinyusdz::Skeleton>((Value *)this,false);
        if (this_25 == (Skeleton *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_25,(Skeleton *)mesh,indent & 0xff,
                   closing_brace);
        break;
      case 0x2003:
        this_23 = Value::as<tinyusdz::SkelAnimation>((Value *)this,false);
        if (this_23 == (SkelAnimation *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_23,(SkelAnimation *)mesh,indent & 0xff,
                   closing_brace);
        break;
      case 0x2004:
        this_24 = Value::as<tinyusdz::BlendShape>((Value *)this,false);
        if (this_24 == (BlendShape *)0x0) goto LAB_00296ce5;
        tinyusdz::to_string_abi_cxx11_
                  ((string *)local_1f8,(tinyusdz *)this_24,(BlendShape *)mesh,indent & 0xff,
                   closing_brace);
        break;
      default:
        goto switchD_002955f6_caseD_5;
      }
      goto LAB_00296cba;
    }
    pcVar16 = "[InternalError: 1D type TypeId mismatch.]";
    lVar13 = 0x29;
    goto LAB_00296cf4;
  }
  switch(iVar3) {
  case 4:
    pVVar4 = Value::as<tinyusdz::value::ValueBlock>((Value *)this,false);
    if (pVVar4 != (ValueBlock *)0x0) {
      pcVar16 = "None";
      lVar13 = 4;
      goto LAB_00296cf4;
    }
    pcVar16 = "[InternalError: ValueBlock type TypeId mismatch.]";
    goto LAB_00296dd2;
  case 5:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x39:
  case 0x3c:
  case 0x48:
  case 0x4f:
  case 0x50:
  case 0x52:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
switchD_002955f6_caseD_5:
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"VALUE_PPRINT: TODO: (type: ",0x1b);
    if (*(long *)(this + 0x10) == 0) {
      local_1f8._0_8_ = &local_1e8;
      local_1f8._8_8_ = (anon_struct_8_0_00000001_for___align)0x4;
      local_1e8._M_allocated_capacity._0_5_ = 0x64696f76;
    }
    else {
      (**(code **)(*(long *)(this + 0x10) + 0x10))(local_1f8);
    }
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    goto LAB_00296cd1;
  case 6:
    str = &Value::as<tinyusdz::Token>((Value *)this,false)->str_;
    if (str != (string *)0x0) {
LAB_00295ed6:
      buildEscapedAndQuotedStringForUSDA((string *)local_1f8,str);
LAB_00295ee4:
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
      goto LAB_00296cd1;
    }
    pcVar16 = "[InternalError: Token type TypeId mismatch.]";
    lVar13 = 0x2c;
    goto LAB_00296cf4;
  case 7:
    str = Value::as<std::__cxx11::string>((Value *)this,false);
    if (str != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00295ed6;
    pcVar16 = "[InternalError: `string` type TypeId mismatch.]";
    lVar13 = 0x2f;
    goto LAB_00296cf4;
  case 8:
    v_16 = Value::as<tinyusdz::value::StringData>((Value *)this,false);
    if (v_16 != (StringData *)0x0) {
      ::std::operator<<(local_1a8,v_16);
      goto LAB_00296cf9;
    }
    pcVar16 = "[InternalError: `string` type TypeId mismatch.]";
    lVar13 = 0x2f;
    goto LAB_00296cf4;
  case 9:
    pbVar11 = Value::as<bool>((Value *)this,false);
    if (pbVar11 != (bool *)0x0) {
      ::std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
      goto LAB_00296cf9;
    }
    break;
  case 0xe:
    v_20 = Value::as<tinyusdz::value::half>((Value *)this,false);
    if (v_20 != (half *)0x0) {
      ::std::operator<<(local_1a8,v_20);
      goto LAB_00296cf9;
    }
    break;
  case 0xf:
    piVar9 = Value::as<int>((Value *)this,false);
    if (piVar9 != (int *)0x0) {
      ::std::ostream::operator<<(local_1a8,*piVar9);
      goto LAB_00296cf9;
    }
    break;
  case 0x10:
    plVar8 = Value::as<long>((Value *)this,false);
    if (plVar8 != (long *)0x0) {
      ::std::ostream::_M_insert<long>((long)local_1a8);
      goto LAB_00296cf9;
    }
    break;
  case 0x11:
    v_11 = Value::as<std::array<tinyusdz::value::half,2ul>>((Value *)this,false);
    if (v_11 != (array<tinyusdz::value::half,_2UL> *)0x0) {
      ::std::operator<<(local_1a8,v_11);
      goto LAB_00296cf9;
    }
    break;
  case 0x12:
    v_13 = Value::as<std::array<tinyusdz::value::half,3ul>>((Value *)this,false);
    if (v_13 != (array<tinyusdz::value::half,_3UL> *)0x0) {
      ::std::operator<<(local_1a8,v_13);
      goto LAB_00296cf9;
    }
    break;
  case 0x13:
    v_17 = Value::as<std::array<tinyusdz::value::half,4ul>>((Value *)this,false);
    if (v_17 != (array<tinyusdz::value::half,_4UL> *)0x0) {
      ::std::operator<<(local_1a8,v_17);
      goto LAB_00296cf9;
    }
    break;
  case 0x14:
    v_25 = Value::as<std::array<int,2ul>>((Value *)this,false);
    if (v_25 != (array<int,_2UL> *)0x0) {
      ::std::operator<<(local_1a8,v_25);
      goto LAB_00296cf9;
    }
    break;
  case 0x15:
    v_26 = Value::as<std::array<int,3ul>>((Value *)this,false);
    if (v_26 != (array<int,_3UL> *)0x0) {
      ::std::operator<<(local_1a8,v_26);
      goto LAB_00296cf9;
    }
    break;
  case 0x16:
    v_24 = Value::as<std::array<int,4ul>>((Value *)this,false);
    if (v_24 != (array<int,_4UL> *)0x0) {
      ::std::operator<<(local_1a8,v_24);
      goto LAB_00296cf9;
    }
    break;
  case 0x1b:
    puVar12 = (unsigned_long *)Value::as<unsigned_int>((Value *)this,false);
    goto joined_r0x00295e6a;
  case 0x1c:
    puVar12 = Value::as<unsigned_long>((Value *)this,false);
joined_r0x00295e6a:
    if (puVar12 != (unsigned_long *)0x0) {
      ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      goto LAB_00296cf9;
    }
    break;
  case 0x25:
    v_19 = Value::as<std::array<unsigned_int,2ul>>((Value *)this,false);
    if (v_19 != (array<unsigned_int,_2UL> *)0x0) {
      ::std::operator<<(local_1a8,v_19);
      goto LAB_00296cf9;
    }
    break;
  case 0x26:
    v_06 = Value::as<std::array<unsigned_int,3ul>>((Value *)this,false);
    if (v_06 != (array<unsigned_int,_3UL> *)0x0) {
      ::std::operator<<(local_1a8,v_06);
      goto LAB_00296cf9;
    }
    break;
  case 0x27:
    v_31 = Value::as<std::array<unsigned_int,4ul>>((Value *)this,false);
    if (v_31 != (array<unsigned_int,_4UL> *)0x0) {
      ::std::operator<<(local_1a8,v_31);
      goto LAB_00296cf9;
    }
    break;
  case 0x28:
    p_Var14 = (_anonymous_namespace_ *)0x0;
    pfVar10 = Value::as<float>((Value *)this,false);
    if (pfVar10 != (float *)0x0) {
      (anonymous_namespace)::dtos_abi_cxx11_((string *)local_1f8,p_Var14,*pfVar10);
      goto LAB_00295ee4;
    }
    pcVar16 = "[InternalError: TypeId mismatch(`float` expected).]";
    lVar13 = 0x33;
    goto LAB_00296cf4;
  case 0x29:
    v_07 = Value::as<std::array<float,2ul>>((Value *)this,false);
    if (v_07 != (array<float,_2UL> *)0x0) {
      ::std::operator<<(local_1a8,v_07);
      goto LAB_00296cf9;
    }
    break;
  case 0x2a:
    v_12 = Value::as<std::array<float,3ul>>((Value *)this,false);
    if (v_12 != (array<float,_3UL> *)0x0) {
      ::std::operator<<(local_1a8,v_12);
      goto LAB_00296cf9;
    }
    break;
  case 0x2b:
    v_08 = Value::as<std::array<float,4ul>>((Value *)this,false);
    if (v_08 != (array<float,_4UL> *)0x0) {
      ::std::operator<<(local_1a8,v_08);
      goto LAB_00296cf9;
    }
    break;
  case 0x2c:
    p_Var14 = (_anonymous_namespace_ *)0x0;
    pdVar7 = Value::as<double>((Value *)this,false);
    if (pdVar7 != (double *)0x0) {
      (anonymous_namespace)::dtos_abi_cxx11_((string *)local_1f8,p_Var14,*pdVar7);
      goto LAB_00295ee4;
    }
    pcVar16 = "[InternalError: TypeId mismatch(`double` expected).]";
    lVar13 = 0x34;
    goto LAB_00296cf4;
  case 0x2d:
    v_14 = Value::as<std::array<double,2ul>>((Value *)this,false);
    if (v_14 != (array<double,_2UL> *)0x0) {
      ::std::operator<<(local_1a8,v_14);
      goto LAB_00296cf9;
    }
    break;
  case 0x2e:
    v_33 = Value::as<std::array<double,3ul>>((Value *)this,false);
    if (v_33 != (array<double,_3UL> *)0x0) {
      ::std::operator<<(local_1a8,v_33);
      goto LAB_00296cf9;
    }
    break;
  case 0x2f:
    v_21 = Value::as<std::array<double,4ul>>((Value *)this,false);
    if (v_21 != (array<double,_4UL> *)0x0) {
      ::std::operator<<(local_1a8,v_21);
      goto LAB_00296cf9;
    }
    break;
  case 0x30:
    v_29 = Value::as<tinyusdz::value::quath>((Value *)this,false);
    if (v_29 != (quath *)0x0) {
      ::std::operator<<(local_1a8,v_29);
      goto LAB_00296cf9;
    }
    break;
  case 0x31:
    v_28 = Value::as<tinyusdz::value::quatf>((Value *)this,false);
    if (v_28 != (quatf *)0x0) {
      ::std::operator<<(local_1a8,v_28);
      goto LAB_00296cf9;
    }
    break;
  case 0x32:
    v_10 = Value::as<tinyusdz::value::quatd>((Value *)this,false);
    if (v_10 != (quatd *)0x0) {
      ::std::operator<<(local_1a8,v_10);
      goto LAB_00296cf9;
    }
    break;
  case 0x36:
    m_01 = Value::as<tinyusdz::value::matrix2d>((Value *)this,false);
    if (m_01 != (matrix2d *)0x0) {
      ::std::operator<<(local_1a8,m_01);
      goto LAB_00296cf9;
    }
    break;
  case 0x37:
    m_00 = Value::as<tinyusdz::value::matrix3d>((Value *)this,false);
    if (m_00 != (matrix3d *)0x0) {
      ::std::operator<<(local_1a8,m_00);
      goto LAB_00296cf9;
    }
    break;
  case 0x38:
    m = Value::as<tinyusdz::value::matrix4d>((Value *)this,false);
    if (m != (matrix4d *)0x0) {
      ::std::operator<<(local_1a8,m);
      goto LAB_00296cf9;
    }
    break;
  case 0x3a:
    v_02 = Value::as<tinyusdz::value::color3f>((Value *)this,false);
    if (v_02 != (color3f *)0x0) {
      ::std::operator<<(local_1a8,v_02);
      goto LAB_00296cf9;
    }
    break;
  case 0x3b:
    v_05 = Value::as<tinyusdz::value::color3d>((Value *)this,false);
    if (v_05 != (color3d *)0x0) {
      ::std::operator<<(local_1a8,v_05);
      goto LAB_00296cf9;
    }
    break;
  case 0x3d:
    v_23 = Value::as<tinyusdz::value::color4f>((Value *)this,false);
    if (v_23 != (color4f *)0x0) {
      ::std::operator<<(local_1a8,v_23);
      goto LAB_00296cf9;
    }
    break;
  case 0x3e:
    v_09 = Value::as<tinyusdz::value::color4d>((Value *)this,false);
    if (v_09 != (color4d *)0x0) {
      ::std::operator<<(local_1a8,v_09);
      goto LAB_00296cf9;
    }
    break;
  case 0x3f:
    v_22 = Value::as<tinyusdz::value::point3h>((Value *)this,false);
    if (v_22 != (point3h *)0x0) {
      ::std::operator<<(local_1a8,v_22);
      goto LAB_00296cf9;
    }
    break;
  case 0x40:
    v_36 = Value::as<tinyusdz::value::point3f>((Value *)this,false);
    if (v_36 != (point3f *)0x0) {
      ::std::operator<<(local_1a8,v_36);
      goto LAB_00296cf9;
    }
    break;
  case 0x41:
    v_30 = Value::as<tinyusdz::value::point3d>((Value *)this,false);
    if (v_30 != (point3d *)0x0) {
      ::std::operator<<(local_1a8,v_30);
      goto LAB_00296cf9;
    }
    break;
  case 0x42:
    v_32 = Value::as<tinyusdz::value::normal3h>((Value *)this,false);
    if (v_32 != (normal3h *)0x0) {
      ::std::operator<<(local_1a8,v_32);
      goto LAB_00296cf9;
    }
    break;
  case 0x43:
    v_03 = Value::as<tinyusdz::value::normal3f>((Value *)this,false);
    if (v_03 != (normal3f *)0x0) {
      ::std::operator<<(local_1a8,v_03);
      goto LAB_00296cf9;
    }
    break;
  case 0x44:
    v_15 = Value::as<tinyusdz::value::normal3d>((Value *)this,false);
    if (v_15 != (normal3d *)0x0) {
      ::std::operator<<(local_1a8,v_15);
      goto LAB_00296cf9;
    }
    break;
  case 0x45:
    v_38 = Value::as<tinyusdz::value::vector3h>((Value *)this,false);
    if (v_38 != (vector3h *)0x0) {
      ::std::operator<<(local_1a8,v_38);
      goto LAB_00296cf9;
    }
    break;
  case 0x46:
    v_34 = Value::as<tinyusdz::value::vector3f>((Value *)this,false);
    if (v_34 != (vector3f *)0x0) {
      ::std::operator<<(local_1a8,v_34);
      goto LAB_00296cf9;
    }
    break;
  case 0x47:
    v_04 = Value::as<tinyusdz::value::vector3d>((Value *)this,false);
    if (v_04 != (vector3d *)0x0) {
      ::std::operator<<(local_1a8,v_04);
      goto LAB_00296cf9;
    }
    break;
  case 0x49:
    v_37 = Value::as<tinyusdz::value::texcoord2h>((Value *)this,false);
    if (v_37 != (texcoord2h *)0x0) {
      ::std::operator<<(local_1a8,v_37);
      goto LAB_00296cf9;
    }
    break;
  case 0x4a:
    v_18 = Value::as<tinyusdz::value::texcoord2f>((Value *)this,false);
    if (v_18 != (texcoord2f *)0x0) {
      ::std::operator<<(local_1a8,v_18);
      goto LAB_00296cf9;
    }
    break;
  case 0x4b:
    v_27 = Value::as<tinyusdz::value::texcoord2d>((Value *)this,false);
    if (v_27 != (texcoord2d *)0x0) {
      ::std::operator<<(local_1a8,v_27);
      goto LAB_00296cf9;
    }
    break;
  case 0x4c:
    v_00 = Value::as<tinyusdz::value::texcoord3h>((Value *)this,false);
    if (v_00 != (texcoord3h *)0x0) {
      ::std::operator<<(local_1a8,v_00);
      goto LAB_00296cf9;
    }
    break;
  case 0x4d:
    v_35 = Value::as<tinyusdz::value::texcoord3f>((Value *)this,false);
    if (v_35 != (texcoord3f *)0x0) {
      ::std::operator<<(local_1a8,v_35);
      goto LAB_00296cf9;
    }
    break;
  case 0x4e:
    v_01 = Value::as<tinyusdz::value::texcoord3d>((Value *)this,false);
    if (v_01 != (texcoord3d *)0x0) {
      ::std::operator<<(local_1a8,v_01);
      goto LAB_00296cf9;
    }
    break;
  case 0x51:
    asset = Value::as<tinyusdz::value::AssetPath>((Value *)this,false);
    if (asset != (AssetPath *)0x0) {
      ::std::operator<<(local_1a8,asset);
      goto LAB_00296cf9;
    }
    pcVar16 = "[InternalError: asset type TypeId mismatch.]";
    lVar13 = 0x2c;
    goto LAB_00296cf4;
  case 0x53:
    customData = Value::
                 as<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                           ((Value *)this,false);
    if (customData ==
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
         *)0x0) {
      pcVar16 = "[InternalError: Dict type TypeId mismatch.]";
      lVar13 = 0x2b;
      goto LAB_00296cf4;
    }
    local_1d8._0_8_ = &aStack_1c8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"");
    print_customData((string *)local_1f8,customData,(string *)local_1d8,(uint32_t)v);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ != &local_1e8) {
      operator_delete((void *)local_1f8._0_8_,local_1e8._M_allocated_capacity + 1);
    }
    uVar15 = aStack_1c8._M_allocated_capacity;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ == &aStack_1c8) goto LAB_00296cf9;
    goto LAB_00296cdb;
  case 0x66:
    Value::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
               local_1d8,(Value *)this,false);
    uVar2 = aStack_1c8._M_allocated_capacity;
    uVar15 = local_1d8._8_8_;
    local_1f8[0] = local_1d8[0];
    if (local_1d8[0] != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0) {
      local_1f8._8_8_ = local_1d8._8_8_;
      local_1e8._M_allocated_capacity = aStack_1c8._M_allocated_capacity;
      local_1e8._8_8_ = aStack_1c8._8_8_;
      local_1d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      aStack_1c8._M_allocated_capacity = 0;
      aStack_1c8._8_8_ = 0;
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_1d8 + 8));
      aStack_1c8._M_allocated_capacity = 0;
      local_1d8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      ::std::
      transform<__gnu_cxx::__normal_iterator<tinyusdz::Token*,std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,tinyusdz::value::pprint_value(tinyusdz::value::Value_const&,unsigned_int,bool)::__0>
                (uVar15,uVar2,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8);
      ::std::operator<<(local_1a8,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1d8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_1f8 + 8));
      goto LAB_00296cf9;
    }
    pcVar16 = "[InternalError: `token[]` type TypeId mismatch.]";
    lVar13 = 0x30;
    goto LAB_00296cf4;
  default:
    switch(iVar3) {
    case 0x401:
      this_00 = Value::as<tinyusdz::Model>((Value *)this,false);
      if (this_00 == (Model *)0x0) {
LAB_00296ce5:
        pcVar16 = "[InternalError: Prim type TypeId mismatch.]";
        lVar13 = 0x2b;
        goto LAB_00296cf4;
      }
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_00,(Model *)mesh,indent & 0xff,closing_brace);
      break;
    case 0x402:
      this_14 = Value::as<tinyusdz::Scope>((Value *)this,false);
      if (this_14 == (Scope *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_14,(Scope *)mesh,indent & 0xff,closing_brace);
      break;
    default:
      goto switchD_002955f6_caseD_5;
    case 0x404:
      this_12 = (tinyusdz *)Value::as<tinyusdz::Xform>((Value *)this,false);
      if (this_12 == (tinyusdz *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,this_12,(Xform *)mesh,indent & 0xff,closing_brace);
      break;
    case 0x405:
      this_16 = Value::as<tinyusdz::GeomMesh>((Value *)this,false);
      if (this_16 == (GeomMesh *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_16,mesh,indent & 0xff,closing_brace);
      break;
    case 0x406:
      this_11 = Value::as<tinyusdz::GeomBasisCurves>((Value *)this,false);
      if (this_11 == (GeomBasisCurves *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_11,(GeomBasisCurves *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x407:
      this_10 = Value::as<tinyusdz::GeomNurbsCurves>((Value *)this,false);
      if (this_10 == (GeomNurbsCurves *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_10,(GeomNurbsCurves *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x408:
      this_15 = Value::as<tinyusdz::GeomSphere>((Value *)this,false);
      if (this_15 == (GeomSphere *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_15,(GeomSphere *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x409:
      this_13 = Value::as<tinyusdz::GeomCube>((Value *)this,false);
      if (this_13 == (GeomCube *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_13,(GeomCube *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x40a:
      this_17 = Value::as<tinyusdz::GeomCylinder>((Value *)this,false);
      if (this_17 == (GeomCylinder *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_17,(GeomCylinder *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x40b:
      this_09 = Value::as<tinyusdz::GeomCone>((Value *)this,false);
      if (this_09 == (GeomCone *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_09,(GeomCone *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x40c:
      this_18 = Value::as<tinyusdz::GeomCapsule>((Value *)this,false);
      if (this_18 == (GeomCapsule *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_18,(GeomCapsule *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x40d:
      this_19 = Value::as<tinyusdz::GeomPoints>((Value *)this,false);
      if (this_19 == (GeomPoints *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_19,(GeomPoints *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x40e:
      this_22 = Value::as<tinyusdz::GeomSubset>((Value *)this,false);
      if (this_22 == (GeomSubset *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_22,(GeomSubset *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x40f:
      this_21 = Value::as<tinyusdz::PointInstancer>((Value *)this,false);
      if (this_21 == (PointInstancer *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_21,(PointInstancer *)mesh,indent & 0xff,
                 closing_brace);
      break;
    case 0x410:
      this_20 = Value::as<tinyusdz::GeomCamera>((Value *)this,false);
      if (this_20 == (GeomCamera *)0x0) goto LAB_00296ce5;
      tinyusdz::to_string_abi_cxx11_
                ((string *)local_1f8,(tinyusdz *)this_20,(GeomCamera *)mesh,indent & 0xff,
                 closing_brace);
    }
LAB_00296cba:
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
LAB_00296cd1:
    uVar15 = local_1e8._M_allocated_capacity;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ != &local_1e8) {
LAB_00296cdb:
      operator_delete(paVar17,(ulong)((long)&(((pointer)uVar15)->_M_dataplus)._M_p + 1));
    }
    goto LAB_00296cf9;
  }
  pcVar16 = "[InternalError: Base type TypeId mismatch.]";
  lVar13 = 0x2b;
LAB_00296cf4:
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar16,lVar13);
LAB_00296cf9:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string pprint_value(const value::Value &v, const uint32_t indent,
                         bool closing_brace) {
#define BASETYPE_CASE_EXPR(__ty)                           \
  case TypeTraits<__ty>::type_id(): {                      \
    auto p = v.as<__ty>();                                 \
    if (p) {                                               \
      os << (*p);                                          \
    } else {                                               \
      os << "[InternalError: Base type TypeId mismatch.]"; \
    }                                                      \
    break;                                                 \
  }

#define PRIMTYPE_CASE_EXPR(__ty)                           \
  case TypeTraits<__ty>::type_id(): {                      \
    auto p = v.as<__ty>();                                 \
    if (p) {                                               \
      os << to_string(*p, indent, closing_brace);          \
    } else {                                               \
      os << "[InternalError: Prim type TypeId mismatch.]"; \
    }                                                      \
    break;                                                 \
  }

#define ARRAY1DTYPE_CASE_EXPR(__ty)                      \
  case TypeTraits<std::vector<__ty>>::type_id(): {       \
    auto p = v.as<std::vector<__ty>>();                  \
    if (p) {                                             \
      os << (*p);                                        \
    } else {                                             \
      os << "[InternalError: 1D type TypeId mismatch.]"; \
    }                                                    \
    break;                                               \
  }

  std::stringstream os;

  switch (v.type_id()) {
    // base type
    CASE_EXPR_LIST(BASETYPE_CASE_EXPR)

    case TypeTraits<float>::type_id(): {
      auto p = v.as<float>();
      if (p) {
        os << dtos(*p);
      } else {
        os << "[InternalError: TypeId mismatch(`float` expected).]";
      }
      break;
    }

    case TypeTraits<double>::type_id(): {
      auto p = v.as<double>();
      if (p) {
        os << dtos(*p);
      } else {
        os << "[InternalError: TypeId mismatch(`double` expected).]";
      }
      break;
    }

      // 1D array
      CASE_EXPR_LIST(ARRAY1DTYPE_CASE_EXPR)

    case TypeTraits<std::vector<float>>::type_id(): {
      auto p = v.as<std::vector<float>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: TypeId mismatch(`float[]` expected).]";
      }
      break;
    }

    case TypeTraits<std::vector<double>>::type_id(): {
      auto p = v.as<std::vector<double>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: TypeId mismatch(`double[]` expected).]";
      }
      break;
    }

      // 2D array
      // CASE_EXPR_LIST(ARRAY2DTYPE_CASE_EXPR)

      // GPrim
      CASE_GPRIM_LIST(PRIMTYPE_CASE_EXPR)

    // dict and customData
    case TypeTraits<CustomDataType>::type_id(): {
      auto p = v.as<CustomDataType>();
      if (p) {
        os << print_customData(*p, "", indent);
      } else {
        os << "[InternalError: Dict type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<value::AssetPath>::type_id(): {
      auto p = v.as<value::AssetPath>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: asset type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<value::AssetPath>>::type_id(): {
      auto p = v.as<std::vector<value::AssetPath>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: asset[] type TypeId mismatch.]";
      }
      break;
    }

    case TypeTraits<value::token>::type_id(): {
      auto p = v.as<value::token>();
      if (p) {
        os << buildEscapedAndQuotedStringForUSDA(p->str());
      } else {
        os << "[InternalError: Token type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<value::token>>::type_id(): {
      auto p = v.get_value<std::vector<value::token>>();
      if (p) {
        std::vector<std::string> vs;
        std::transform(p->begin(), p->end(), std::back_inserter(vs),
                       [](const value::token &tok) {
                         return buildEscapedAndQuotedStringForUSDA(tok.str());
                       });

        os << vs;
      } else {
        os << "[InternalError: `token[]` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::string>::type_id(): {
      auto p = v.as<std::string>();
      if (p) {
        os << buildEscapedAndQuotedStringForUSDA(*p);
      } else {
        os << "[InternalError: `string` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<value::StringData>::type_id(): {
      auto p = v.as<value::StringData>();
      if (p) {
        os << (*p);  // FIXME: Call buildEscapedAndQuotedStringForUSDA() here?
      } else {
        os << "[InternalError: `string` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<std::string>>::type_id(): {
      auto p = v.as<std::vector<std::string>>();
      if (p) {
        std::vector<std::string> ss;
        for (const auto &item : *p) {
          ss.push_back(buildEscapedAndQuotedStringForUSDA(item));
        }
        os << ss;  // Use operator<<(std::vector<std::string>)
      } else {
        os << "[InternalError: `string[]` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<std::vector<value::StringData>>::type_id(): {
      auto p = v.as<std::vector<value::StringData>>();
      if (p) {
        os << (*p);
      } else {
        os << "[InternalError: `string[]` type TypeId mismatch.]";
      }
      break;
    }
    case TypeTraits<value::ValueBlock>::type_id(): {
      if (v.as<value::ValueBlock>()) {
        os << "None";
      } else {
        os << "[InternalError: ValueBlock type TypeId mismatch.]";
      }
      break;
    }
    // TODO: List-up all case and remove `default` clause.
    default: {
      os << "VALUE_PPRINT: TODO: (type: " << v.type_name() << ") ";
    }
  }

#undef BASETYPE_CASE_EXPR
#undef PRIMTYPE_CASE_EXPR
#undef ARRAY1DTYPE_CASE_EXPR
#undef ARRAY2DTYPE_CASE_EXPR

  return os.str();
}